

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamToolsIndex::WriteReferenceEntry
          (BamToolsIndex *this,BtiReferenceEntry *refEntry)

{
  size_type sVar1;
  undefined8 uVar2;
  long in_RSI;
  long in_RDI;
  int64_t numBytesWritten;
  uint32_t numBlocks;
  BtiBlockVector *in_stack_ffffffffffffff68;
  BamToolsIndex *in_stack_ffffffffffffff70;
  allocator *paVar3;
  allocator local_79;
  string local_78 [8];
  string *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  BamException *in_stack_ffffffffffffffa0;
  allocator local_41;
  string local_40 [32];
  long local_20;
  uint32_t local_14 [5];
  
  sVar1 = std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>::
          size((vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>
                *)(in_RSI + 8));
  local_14[0] = (uint32_t)sVar1;
  if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
    SwapEndian_32(local_14);
  }
  local_20 = (**(code **)(**(long **)(in_RDI + 0x60) + 0x40))(*(long **)(in_RDI + 0x60),local_14,4);
  if (local_20 != 4) {
    uVar2 = __cxa_allocate_exception(0x28);
    paVar3 = &local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"BamToolsIndex::WriteReferenceEntry",paVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"could not write number of blocks",&local_79);
    BamException::BamException
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    __cxa_throw(uVar2,&BamException::typeinfo,BamException::~BamException);
  }
  WriteBlocks(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  return;
}

Assistant:

void BamToolsIndex::WriteReferenceEntry(const BtiReferenceEntry& refEntry)
{

    // write number of blocks this reference
    uint32_t numBlocks = refEntry.Blocks.size();
    if (m_isBigEndian) SwapEndian_32(numBlocks);
    const int64_t numBytesWritten =
        m_resources.Device->Write((const char*)&numBlocks, sizeof(numBlocks));
    if (numBytesWritten != sizeof(numBlocks))
        throw BamException("BamToolsIndex::WriteReferenceEntry",
                           "could not write number of blocks");

    // write actual block entries
    WriteBlocks(refEntry.Blocks);
}